

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O2

void __thiscall
peg::Sequence::
Sequence<std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
          (Sequence *this,shared_ptr<peg::Ope> *args,shared_ptr<peg::Ope> *args_1,
          shared_ptr<peg::Ope> *args_2,shared_ptr<peg::Ope> *args_3,shared_ptr<peg::Ope> *args_4)

{
  long lVar1;
  initializer_list<std::shared_ptr<peg::Ope>_> __l;
  allocator_type local_81;
  __shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__Sequence_00169c90;
  std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,&args->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,&args_1->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&args_2->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&args_3->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&args_4->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_80;
  std::vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_>::vector
            (&this->opes_,__l,&local_81);
  lVar1 = 0x48;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_80._M_ptr + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  return;
}

Assistant:

Sequence(const Args &...args)
      : opes_{static_cast<std::shared_ptr<Ope>>(args)...} {}